

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

Price * __thiscall Application::queryPrice(Price *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  double local_20;
  double value;
  Application *this_local;
  
  value = (double)this;
  this_local = (Application *)__return_storage_ptr__;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"Price: ");
  std::istream::operator>>(&std::cin,&local_20);
  FIX::Price::Price(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

FIX::Price Application::queryPrice() {
  double value;
  std::cout << std::endl << "Price: ";
  std::cin >> value;
  return FIX::Price(value);
}